

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fsm.cpp
# Opt level: O2

void __thiscall
GdlPass::DebugFsmTable(GdlPass *this,GrcManager *param_1,ostream *strmOut,bool fWorking)

{
  ulong uVar1;
  pointer ppFVar2;
  pointer ppFVar3;
  FsmState *pFVar4;
  vector<FsmState_*,_std::allocator<FsmState_*>_> *pvVar5;
  ostream *poVar6;
  long lVar7;
  int extraout_EDX;
  int iVar8;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  uint ifsmc;
  ulong uVar10;
  FsmState *this_00;
  char *pcVar11;
  vector<FsmState_*,_std::allocator<FsmState_*>_> *pvVar12;
  uint uVar13;
  uint ifsmc_2;
  undefined8 uVar9;
  
  if (this->m_pfsm == (FsmTable *)0x0) {
    pcVar11 = "No fsm\n";
  }
  else {
    uVar1 = this->m_pfsm->m_cfsmc;
    pcVar11 = "\nFinal Table:            ";
    if (fWorking) {
      pcVar11 = "\nWorking Table:          ";
    }
    std::operator<<(strmOut,pcVar11);
    for (uVar10 = 0; uVar10 < uVar1; uVar10 = (ulong)((int)uVar10 + 1)) {
      OutputNumber(strmOut,(int)uVar10,6);
    }
    std::operator<<(strmOut,"\n                          ");
    for (uVar10 = 0; uVar10 < uVar1; uVar10 = (ulong)((int)uVar10 + 1)) {
      std::operator<<(strmOut,"- - - ");
    }
    pvVar12 = &this->m_pfsm->m_vpfstate;
    pvVar5 = &this->m_pfsm->m_vpfstate;
    if (!fWorking) {
      pvVar12 = (vector<FsmState_*,_std::allocator<FsmState_*>_> *)&this->m_vifsFinalToWork;
      pvVar5 = (vector<FsmState_*,_std::allocator<FsmState_*>_> *)&this->m_vifsFinalToWork;
    }
    ppFVar2 = (pvVar5->super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>)._M_impl.
              super__Vector_impl_data._M_finish;
    ppFVar3 = (pvVar12->super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>)._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar13 = 0;
        (ulong)uVar13 < (ulong)((long)ppFVar2 - (long)ppFVar3 >> (fWorking + 2U & 0x3f));
        uVar13 = uVar13 + 1) {
      if (fWorking) {
        this_00 = (this->m_pfsm->m_vpfstate).
                  super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar13];
      }
      else {
        pFVar4 = (this->m_pfsm->m_vpfstate).
                 super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
                 super__Vector_impl_data._M_start
                 [(this->m_vifsFinalToWork).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar13]];
        this_00 = pFVar4->m_pfstateMerged;
        if (this_00 == (FsmState *)0x0) {
          this_00 = pFVar4;
        }
      }
      poVar6 = std::operator<<(strmOut,"\n");
      poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
      poVar6 = std::operator<<(poVar6,": ");
      poVar6 = (ostream *)std::ostream::operator<<(poVar6,this_00->m_critSlotsMatched);
      std::operator<<(poVar6,"\n");
      if (this_00->m_pfstateMerged == (FsmState *)0x0) {
        std::operator<<(strmOut,"                        ");
        uVar10 = 0;
        uVar9 = extraout_RDX;
        while( true ) {
          iVar8 = (int)uVar9;
          if (uVar1 <= uVar10) break;
          std::operator<<(strmOut," ");
          iVar8 = (this_00->m_vgiCells).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[(int)uVar10];
          if (!fWorking) {
            lVar7 = (long)iVar8;
            pFVar4 = (this->m_pfsm->m_vpfstate).
                     super__Vector_base<FsmState_*,_std::allocator<FsmState_*>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar7]->m_pfstateMerged;
            if (pFVar4 != (FsmState *)0x0) {
              lVar7 = (long)pFVar4->m_ifsWorkIndex;
            }
            iVar8 = (this->m_vifsWorkToFinal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar7];
          }
          OutputNumber(strmOut,iVar8,5);
          uVar10 = (ulong)((int)uVar10 + 1);
          uVar9 = extraout_RDX_00;
        }
      }
      else {
        poVar6 = std::operator<<(strmOut,"  => state #");
        std::ostream::operator<<(poVar6,this_00->m_pfstateMerged->m_ifsWorkIndex);
        iVar8 = extraout_EDX;
      }
      FsmState::DebugFsmState(this_00,strmOut,iVar8);
    }
    std::operator<<(strmOut,"\n                          ");
    pcVar11 = "\n\n";
    for (uVar10 = 0; uVar10 < uVar1; uVar10 = (ulong)((int)uVar10 + 1)) {
      std::operator<<(strmOut,"- - - ");
    }
  }
  std::operator<<(strmOut,pcVar11);
  return;
}

Assistant:

void GdlPass::DebugFsmTable(GrcManager * /*pcman*/, std::ostream & strmOut, bool fWorking)
{
	if (m_pfsm == NULL)
	{
		strmOut << "No fsm\n";
		return;
	}

	auto const cfsmc = m_pfsm->NumberOfColumns();
	if (fWorking)
		strmOut << "\nWorking Table:          ";
	else
		strmOut << "\nFinal Table:            ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)	// column headers
		OutputNumber(strmOut, ifsmc, 6);
	strmOut << "\n                          ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
		strmOut << "- - - ";


	auto ifsLim = (fWorking)? m_pfsm->RawNumberOfStates() : m_vifsFinalToWork.size();
	for (auto ifs = 0U; ifs < ifsLim; ++ifs)
	{
		FsmState * pfstate = (fWorking) ?
			m_pfsm->RawStateAt(ifs) :
			m_pfsm->StateAt(m_vifsFinalToWork[ifs]);

		strmOut << "\n" << ifs << ": " << pfstate->SlotsMatched() << "\n";

		if (pfstate->HasBeenMerged())
		{
			Assert(fWorking);
			strmOut << "  => state #" << pfstate->MergedState()->WorkIndex();
		}
		else
		{
			strmOut << "                        ";

			for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
			{
				strmOut << " ";
				int ifsmcValue = pfstate->CellValue(ifsmc);
				if (!fWorking)
				{
					if (m_pfsm->RawStateAt(ifsmcValue)->HasBeenMerged())
						ifsmcValue = m_pfsm->RawStateAt(ifsmcValue)->MergedState()->WorkIndex();
					ifsmcValue = m_vifsWorkToFinal[ifsmcValue];
				}
				OutputNumber(strmOut, ifsmcValue, 5);
			}
		}

		pfstate->DebugFsmState(strmOut, ifs);
	}

	strmOut << "\n                          ";
	for (auto ifsmc = 0U; ifsmc < cfsmc; ++ifsmc)
		strmOut << "- - - ";
	strmOut << "\n\n";
}